

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

size_t __thiscall CLI::App::remaining_size(App *this,bool recurse)

{
  pointer psVar1;
  size_t sVar2;
  size_t sVar3;
  undefined7 in_register_00000031;
  App_p *sub;
  pointer psVar4;
  
  sVar2 = ::std::
          __count_if<__gnu_cxx::__normal_iterator<std::pair<CLI::detail::Classifier,std::__cxx11::string>const*,std::vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::remaining_size(bool)const::_lambda(std::pair<CLI::detail::Classifier,std::__cxx11::string>const&)_1_>>
                    ((this->missing_).
                     super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->missing_).
                     super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if ((int)CONCAT71(in_register_00000031,recurse) != 0) {
    psVar1 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (this->subcommands_).
                  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      sVar3 = remaining_size((psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,true);
      sVar2 = sVar2 + sVar3;
    }
  }
  return sVar2;
}

Assistant:

std::size_t remaining_size(bool recurse = false) const {
        auto remaining_options = static_cast<std::size_t>(std::count_if(
            std::begin(missing_), std::end(missing_), [](const std::pair<detail::Classifier, std::string> &val) {
                return val.first != detail::Classifier::POSITIONAL_MARK;
            }));

        if(recurse) {
            for(const App_p &sub : subcommands_) {
                remaining_options += sub->remaining_size(recurse);
            }
        }
        return remaining_options;
    }